

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O1

int __thiscall MixerContext::init(MixerContext *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int ch_in;
  uint32_t i;
  int iVar5;
  long lVar6;
  uint32_t j;
  long lVar7;
  ulong uVar8;
  double (*padVar9) [32];
  int32_t (*paiVar10) [32];
  ulong uVar11;
  double dVar12;
  double dVar13;
  
  iVar1 = auto_matrix(this);
  iVar5 = -1;
  if (iVar1 == 0) {
    if ((this->_format == CUBEB_SAMPLE_S16LE) && (this->_out_ch_count != 0)) {
      padVar9 = this->_matrix;
      uVar11 = 0;
      iVar1 = 0;
      do {
        iVar5 = 0;
        if (this->_in_ch_count != 0) {
          uVar8 = 0;
          dVar12 = 0.0;
          iVar5 = 0;
          do {
            dVar13 = (*padVar9)[uVar8] * 32768.0 + dVar12;
            lVar6 = lrintf((float)dVar13);
            iVar2 = (int)lVar6;
            dVar12 = dVar12 + (dVar13 - (double)iVar2);
            iVar4 = -iVar2;
            if (0 < iVar2) {
              iVar4 = iVar2;
            }
            iVar5 = iVar5 + iVar4;
            uVar8 = uVar8 + 1;
          } while (uVar8 < this->_in_ch_count);
        }
        if (iVar1 <= iVar5) {
          iVar1 = iVar5;
        }
        uVar11 = uVar11 + 1;
        padVar9 = padVar9 + 1;
      } while (uVar11 < this->_out_ch_count);
      if (0x8000 < iVar1) {
        this->_clipping = true;
      }
    }
    padVar9 = this->_matrix;
    paiVar10 = this->_matrix32;
    lVar6 = 0;
    do {
      lVar7 = 0;
      iVar1 = 0;
      do {
        lVar3 = lrintf((float)((*padVar9)[lVar7] * 32768.0));
        (*paiVar10)[lVar7] = (int32_t)lVar3;
        if (((*padVar9)[lVar7] != 0.0) || (NAN((*padVar9)[lVar7]))) {
          lVar3 = (long)iVar1;
          iVar1 = iVar1 + 1;
          this->_matrix_ch[lVar6][lVar3 + 1] = (uint8_t)lVar7;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      this->_matrix_ch[lVar6][0] = (uint8_t)iVar1;
      lVar6 = lVar6 + 1;
      padVar9 = padVar9 + 1;
      paiVar10 = paiVar10 + 1;
    } while (lVar6 != 0x20);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int MixerContext::init()
{
  int r = auto_matrix();
  if (r) {
    return r;
  }

  // Determine if matrix operation would overflow
  if (_format == CUBEB_SAMPLE_S16NE) {
    int maxsum = 0;
    for (uint32_t i = 0; i < _out_ch_count; i++) {
      double rem = 0;
      int sum = 0;

      for (uint32_t j = 0; j < _in_ch_count; j++) {
        double target = _matrix[i][j] * 32768 + rem;
        int value = lrintf(target);
        rem += target - value;
        sum += std::abs(value);
      }
      maxsum = std::max(maxsum, sum);
    }
    if (maxsum > 32768) {
      _clipping = true;
    }
  }

  // FIXME quantize for integers
  for (uint32_t i = 0; i < CHANNELS_MAX; i++) {
    int ch_in = 0;
    for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
      _matrix32[i][j] = lrintf(_matrix[i][j] * 32768);
      if (_matrix[i][j]) {
        _matrix_ch[i][++ch_in] = j;
      }
    }
    _matrix_ch[i][0] = ch_in;
  }

  return 0;
}